

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

void __thiscall sf::RenderTarget::applyBlendMode(RenderTarget *this,BlendMode *mode)

{
  Equation EVar1;
  Factor FVar2;
  Factor FVar3;
  PFNGLBLENDEQUATIONEXTPROC p_Var4;
  PFNGLBLENDEQUATIONSEPARATEEXTPROC p_Var5;
  PFNGLBLENDFUNCPROC p_Var6;
  PFNGLBLENDFUNCSEPARATEEXTPROC p_Var7;
  Uint32 UVar8;
  Uint32 UVar9;
  Uint32 UVar10;
  Uint32 UVar11;
  ostream *poVar12;
  
  p_Var7 = sf_glad_glBlendFuncSeparateEXT;
  p_Var6 = sf_glad_glBlendFunc;
  if (SF_GLAD_GL_EXT_blend_func_separate == 0) {
    UVar8 = anon_unknown.dwarf_35c620::RenderTargetImpl::factorToGlConstant(mode->colorSrcFactor);
    UVar9 = anon_unknown.dwarf_35c620::RenderTargetImpl::factorToGlConstant(mode->colorDstFactor);
    (*p_Var6)(UVar8,UVar9);
  }
  else {
    UVar8 = anon_unknown.dwarf_35c620::RenderTargetImpl::factorToGlConstant(mode->colorSrcFactor);
    UVar9 = anon_unknown.dwarf_35c620::RenderTargetImpl::factorToGlConstant(mode->colorDstFactor);
    UVar10 = anon_unknown.dwarf_35c620::RenderTargetImpl::factorToGlConstant(mode->alphaSrcFactor);
    UVar11 = anon_unknown.dwarf_35c620::RenderTargetImpl::factorToGlConstant(mode->alphaDstFactor);
    (*p_Var7)(UVar8,UVar9,UVar10,UVar11);
  }
  p_Var5 = sf_glad_glBlendEquationSeparateEXT;
  p_Var4 = sf_glad_glBlendEquationEXT;
  if (SF_GLAD_GL_EXT_blend_subtract == 0 && SF_GLAD_GL_EXT_blend_minmax == 0) {
    if ((mode->alphaEquation != Add || mode->colorEquation != Add) &&
       (applyBlendMode(sf::BlendMode_const&)::warned == '\0')) {
      poVar12 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"OpenGL extension EXT_blend_minmax and EXT_blend_subtract unavailable",0x44
                );
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      poVar12 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"Selecting a blend equation not possible",0x27);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      poVar12 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"Ensure that hardware acceleration is enabled if available",0x39);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      applyBlendMode(sf::BlendMode_const&)::warned = '\x01';
    }
  }
  else if (SF_GLAD_GL_EXT_blend_equation_separate == 0) {
    UVar8 = anon_unknown.dwarf_35c620::RenderTargetImpl::equationToGlConstant(mode->colorEquation);
    (*p_Var4)(UVar8);
  }
  else {
    UVar8 = anon_unknown.dwarf_35c620::RenderTargetImpl::equationToGlConstant(mode->colorEquation);
    UVar9 = anon_unknown.dwarf_35c620::RenderTargetImpl::equationToGlConstant(mode->alphaEquation);
    (*p_Var5)(UVar8,UVar9);
  }
  EVar1 = mode->alphaEquation;
  (this->m_cache).lastBlendMode.alphaDstFactor = mode->alphaDstFactor;
  (this->m_cache).lastBlendMode.alphaEquation = EVar1;
  FVar2 = mode->colorDstFactor;
  EVar1 = mode->colorEquation;
  FVar3 = mode->alphaSrcFactor;
  (this->m_cache).lastBlendMode.colorSrcFactor = mode->colorSrcFactor;
  (this->m_cache).lastBlendMode.colorDstFactor = FVar2;
  (this->m_cache).lastBlendMode.colorEquation = EVar1;
  (this->m_cache).lastBlendMode.alphaSrcFactor = FVar3;
  return;
}

Assistant:

void RenderTarget::applyBlendMode(const BlendMode& mode)
{
    using RenderTargetImpl::factorToGlConstant;
    using RenderTargetImpl::equationToGlConstant;

    // Apply the blend mode, falling back to the non-separate versions if necessary
    if (GLEXT_blend_func_separate)
    {
        glCheck(GLEXT_glBlendFuncSeparate(
            factorToGlConstant(mode.colorSrcFactor), factorToGlConstant(mode.colorDstFactor),
            factorToGlConstant(mode.alphaSrcFactor), factorToGlConstant(mode.alphaDstFactor)));
    }
    else
    {
        glCheck(glBlendFunc(
            factorToGlConstant(mode.colorSrcFactor),
            factorToGlConstant(mode.colorDstFactor)));
    }

    if (GLEXT_blend_minmax || GLEXT_blend_subtract)
    {
        if (GLEXT_blend_equation_separate)
        {
            glCheck(GLEXT_glBlendEquationSeparate(
                equationToGlConstant(mode.colorEquation),
                equationToGlConstant(mode.alphaEquation)));
        }
        else
        {
            glCheck(GLEXT_glBlendEquation(equationToGlConstant(mode.colorEquation)));
        }
    }
    else if ((mode.colorEquation != BlendMode::Add) || (mode.alphaEquation != BlendMode::Add))
    {
        static bool warned = false;

        if (!warned)
        {
#ifdef SFML_OPENGL_ES
            err() << "OpenGL ES extension OES_blend_subtract unavailable" << std::endl;
#else
            err() << "OpenGL extension EXT_blend_minmax and EXT_blend_subtract unavailable" << std::endl;
#endif
            err() << "Selecting a blend equation not possible" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

            warned = true;
        }
    }

    m_cache.lastBlendMode = mode;
}